

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaSimple.c
# Opt level: O1

Vec_Wrd_t * Pla_ManFxMinimize(word *pOn,int nVars)

{
  ulong *puVar1;
  Vec_Wrd_t *pVVar2;
  word *pwVar3;
  void *__ptr;
  Vec_Int_t *p;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  word wVar20;
  int Count [32];
  int pDirs [32];
  int local_1e8;
  uint local_1dc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  int local_138 [32];
  uint local_b8;
  byte local_b4;
  
  uVar19 = 1 << ((byte)nVars & 0x1f);
  uVar17 = ((int)uVar19 >> 6) + (uint)((uint)nVars < 6);
  pVVar2 = (Vec_Wrd_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  pwVar3 = (word *)malloc(8000);
  pVVar2->pArray = pwVar3;
  __ptr = calloc((long)(int)uVar17,8);
  local_138[0x1c] = 0;
  local_138[0x1d] = 0;
  local_138[0x1e] = 0;
  local_138[0x1f] = 0;
  local_138[0x18] = 0;
  local_138[0x19] = 0;
  local_138[0x1a] = 0;
  local_138[0x1b] = 0;
  local_138[0x14] = 0;
  local_138[0x15] = 0;
  local_138[0x16] = 0;
  local_138[0x17] = 0;
  local_138[0x10] = 0;
  local_138[0x11] = 0;
  local_138[0x12] = 0;
  local_138[0x13] = 0;
  local_138[0xc] = 0;
  local_138[0xd] = 0;
  local_138[0xe] = 0;
  local_138[0xf] = 0;
  local_138[8] = 0;
  local_138[9] = 0;
  local_138[10] = 0;
  local_138[0xb] = 0;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 0;
  local_138[7] = 0;
  local_138[0] = 0;
  local_138[1] = 0;
  local_138[2] = 0;
  local_138[3] = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar4 = (int *)malloc(4000);
  p->pArray = piVar4;
  iVar16 = (int)local_1b8;
  if (nVars != 0x1f) {
    local_1dc = local_1b8._4_4_;
    uVar11 = 1;
    if (1 < (int)uVar19) {
      uVar11 = uVar19;
    }
    uVar5 = 0;
    do {
      uVar13 = (uint)uVar5;
      uVar9 = uVar5 >> 6;
      if ((pOn[uVar9] >> (uVar5 & 0x3f) & 1) != 0) {
        uVar10 = uVar13 & 0x3f;
        uVar5 = *(ulong *)((long)__ptr + uVar9 * 8);
        if ((uVar5 >> uVar10 & 1) == 0) {
          iVar6 = 0;
          if (0 < nVars) {
            uVar14 = 0;
            do {
              uVar12 = uVar13 ^ 1 << (uVar14 & 0x1f);
              if ((pOn[(int)uVar12 >> 6] >> ((ulong)uVar12 & 0x3f) & 1) != 0) {
                lVar15 = (long)iVar6;
                iVar6 = iVar6 + 1;
                (&local_b8)[lVar15] = uVar14;
              }
              uVar14 = uVar14 + 1;
            } while (nVars != uVar14);
          }
          local_138[iVar6] = local_138[iVar6] + 1;
          if (iVar6 == 2) {
            uVar10 = 1 << ((byte)local_b8 & 0x1f) ^ 1 << (local_b4 & 0x1f) ^ uVar13;
            if ((pOn[(int)uVar10 >> 6] >> ((ulong)uVar10 & 0x3f) & 1) != 0) {
              local_1b8 = CONCAT44(local_1dc,iVar16);
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                            ,0xdb,"Vec_Wrd_t *Pla_ManFxMinimize(word *, int)");
            }
          }
          else {
            if (iVar6 == 1) {
              uVar14 = uVar13 ^ 1 << (local_b8 & 0x1f);
              *(ulong *)((long)__ptr + uVar9 * 8) = uVar5 | 1L << uVar10;
              puVar1 = (ulong *)((long)__ptr + (long)((int)uVar14 >> 6) * 8);
              *puVar1 = *puVar1 | 1L << ((byte)uVar14 & 0x3f);
              local_1dc = local_1dc + 1;
              uVar10 = local_b8;
            }
            else {
              if (iVar6 != 0) goto LAB_00370f44;
              *(ulong *)((long)__ptr + uVar9 * 8) = uVar5 | 1L << uVar10;
              iVar16 = iVar16 + 1;
              uVar10 = 0xffffffff;
            }
            Vec_IntPush(p,uVar13);
            Vec_IntPush(p,uVar10);
          }
        }
      }
LAB_00370f44:
      uVar5 = (ulong)(uVar13 + 1);
    } while (uVar13 + 1 != uVar11);
    local_1b8 = (ulong)local_1dc << 0x20;
  }
  local_1b8 = CONCAT44(local_1b8._4_4_,iVar16);
  if (nVars != 0x1f) {
    local_1e8 = (int)uStack_190;
    uVar11 = 1;
    if (1 < (int)uVar19) {
      uVar11 = uVar19;
    }
    uVar5 = 0;
    do {
      uVar19 = (uint)uVar5;
      uVar9 = uVar5 >> 6;
      if ((pOn[uVar9] >> (uVar5 & 0x3f) & 1) != 0) {
        uVar5 = *(ulong *)((long)__ptr + uVar9 * 8);
        if ((uVar5 >> (uVar19 & 0x3f) & 1) == 0) {
          uVar13 = 0;
          if (0 < nVars) {
            uVar13 = 0;
            uVar10 = 0;
            do {
              uVar14 = uVar19 ^ 1 << (uVar10 & 0x1f);
              if ((pOn[(int)uVar14 >> 6] >> ((ulong)uVar14 & 0x3f) & 1) != 0) {
                lVar15 = (long)(int)uVar13;
                uVar13 = uVar13 + 1;
                (&local_b8)[lVar15] = uVar10;
              }
              uVar10 = uVar10 + 1;
            } while (nVars != uVar10);
          }
          uVar8 = 0;
          if (0 < (int)uVar13) {
            uVar7 = 0;
            do {
              uVar10 = uVar19 ^ 1 << ((byte)(&local_b8)[uVar7] & 0x1f);
              if (((pOn[(int)uVar10 >> 6] >> ((ulong)uVar10 & 0x3f) & 1) != 0) &&
                 (uVar8 = uVar7,
                 (*(ulong *)((long)__ptr + (long)((int)uVar10 >> 6) * 8) >> (uVar10 & 0x3f) & 1) ==
                 0)) break;
              uVar7 = uVar7 + 1;
              uVar8 = (ulong)uVar13;
            } while (uVar13 != uVar7);
          }
          uVar7 = uVar8 & 0xffffffff;
          if ((uint)uVar8 == uVar13) {
            uVar7 = 0;
          }
          uVar13 = (&local_b8)[uVar7];
          uVar10 = uVar19 ^ 1 << (uVar13 & 0x1f);
          *(ulong *)((long)__ptr + uVar9 * 8) = uVar5 | 1L << (uVar19 & 0x3f);
          puVar1 = (ulong *)((long)__ptr + (long)((int)uVar10 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)uVar10 & 0x3f);
          local_1e8 = local_1e8 + 1;
          Vec_IntPush(p,uVar19);
          Vec_IntPush(p,uVar13);
        }
      }
      uVar5 = (ulong)(uVar19 + 1);
    } while (uVar19 + 1 != uVar11);
    uStack_190 = CONCAT44(uStack_190._4_4_,local_1e8);
  }
  putchar(10);
  if ((int)uVar17 < 1) {
    printf("Truth = %d. ",0);
  }
  else {
    uVar5 = 0;
    uVar9 = 0;
    do {
      uVar8 = pOn[uVar5] - (pOn[uVar5] >> 1 & 0x5555555555555555);
      uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
      uVar8 = (uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f;
      uVar8 = (uVar8 >> 8) + uVar8;
      lVar15 = (uVar8 >> 0x10) + uVar8;
      uVar9 = (ulong)((int)uVar9 + ((int)((ulong)lVar15 >> 0x20) + (int)lVar15 & 0xffU));
      uVar5 = uVar5 + 1;
    } while (uVar17 != uVar5);
    printf("Truth = %d. ",uVar9);
    if (0 < (int)uVar17) {
      uVar5 = 0;
      do {
        uVar5 = uVar5 + 1;
      } while (uVar17 != uVar5);
    }
  }
  printf("Cover = %d. ");
  putchar(10);
  printf("Count: ");
  lVar15 = 0;
  do {
    if (local_138[lVar15] != 0) {
      printf("%d=%d ");
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x10);
  putchar(10);
  printf("Cubes: ");
  lVar15 = 0;
  do {
    if (*(int *)((long)&local_1b8 + lVar15 * 4) != 0) {
      printf("%d=%d ");
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x10);
  putchar(10);
  iVar16 = p->nSize;
  if (1 < iVar16) {
    piVar4 = p->pArray;
    lVar15 = (long)pVVar2->nSize;
    uVar17 = pVVar2->nCap;
    lVar18 = 0;
    do {
      if (nVars < 1) {
        wVar20 = 0;
      }
      else {
        uVar19 = 0;
        uVar11 = 0;
        wVar20 = 0;
        do {
          if (piVar4[lVar18 + 1] != uVar11) {
            if (((uint)piVar4[lVar18] >> (uVar11 & 0x1f) & 1) == 0) {
              wVar20 = wVar20 | 1L << (uVar19 & 0x3e);
            }
            else {
              wVar20 = wVar20 | 2L << (sbyte)(uVar19 & 0x3e);
            }
          }
          uVar11 = uVar11 + 1;
          uVar19 = uVar19 + 2;
        } while (nVars != uVar11);
      }
      uVar19 = uVar17;
      if (uVar17 == (uint)lVar15) {
        if ((int)uVar17 < 0x10) {
          if (pVVar2->pArray == (word *)0x0) {
            pwVar3 = (word *)malloc(0x80);
          }
          else {
            pwVar3 = (word *)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = pwVar3;
          uVar11 = 0x10;
        }
        else {
          uVar11 = uVar17 * 2;
          if ((int)uVar11 <= (int)uVar17) goto LAB_00371350;
          if (pVVar2->pArray == (word *)0x0) {
            pwVar3 = (word *)malloc((ulong)uVar11 << 3);
          }
          else {
            pwVar3 = (word *)realloc(pVVar2->pArray,(ulong)uVar11 << 3);
          }
          pVVar2->pArray = pwVar3;
        }
        uVar19 = uVar11;
        if (pwVar3 == (word *)0x0) {
          pVVar2->nSize = (uint)lVar15;
          pVVar2->nCap = uVar17;
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                        ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
      }
LAB_00371350:
      uVar17 = uVar19;
      pVVar2->pArray[lVar15] = wVar20;
      lVar15 = lVar15 + 1;
      lVar18 = lVar18 + 2;
    } while ((int)((uint)lVar18 | 1) < iVar16);
    pVVar2->nSize = (int)lVar15;
    pVVar2->nCap = uVar17;
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return pVVar2;
}

Assistant:

Vec_Wrd_t * Pla_ManFxMinimize( word * pOn, int nVars )
{
    int i, v, iMint, iVar, nMints = (1 << nVars);
    int nWords = Abc_Bit6WordNum( nMints );
    Vec_Wrd_t * vCubes = Vec_WrdAlloc( 1000 );
    word * pDc = ABC_CALLOC( word, nWords );
    int Count[32] = {0};
    int Cubes[32] = {0};
    Vec_Int_t * vStore = Vec_IntAlloc( 1000 );

    // count the number of expansion directions
    for ( i = 0; i < nMints; i++ )
        if ( Pla_TtGetBit(pOn, i) && !Pla_TtGetBit(pDc, i) )
        {
            int pDirs[32], nDirs = Pla_ManExpendDirNum(pOn, nVars, i, pDirs);
            Count[nDirs]++;
            if ( nDirs == 0 )
            {
                Pla_TtSetBit(pDc, i);
                Cubes[0]++;
                // save
                Vec_IntPushTwo( vStore, i, -1 );
                continue;
            }
            if ( nDirs == 1 )
            {
                //Pla_PrintBinary( (word *)&i, nVars );
                //printf( " %d \n", pDirs[0] );

                Pla_TtSetBit(pDc, i);
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[0]));
                Cubes[1]++;
                // save
                Vec_IntPushTwo( vStore, i, pDirs[0] );
                continue;
            }
            if ( nDirs == 2 && Pla_TtGetBit(pOn, i ^ (1 << pDirs[0]) ^ (1 << pDirs[1])) )
            {
                assert( 0 );
                Pla_TtSetBit(pDc, i);
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[0]));
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[1]));
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[0]) ^ (1 << pDirs[1]));
                Cubes[2]++;
                continue;
            }
        }

    // go through the remaining cubes
    for ( i = 0; i < nMints; i++ )
        if ( Pla_TtGetBit(pOn, i) && !Pla_TtGetBit(pDc, i) )
        {
            int pDirs[32], nDirs = Pla_ManExpendDirNum(pOn, nVars, i, pDirs);
            // find direction, which is not taken
            for ( v = 0; v < nDirs; v++ )
                if ( Pla_TtGetBit(pOn, i ^ (1 << pDirs[v])) && !Pla_TtGetBit(pDc, i ^ (1 << pDirs[v])) )
                    break;
            // if there is no open directions, use any one
            if ( v == nDirs )
                v = 0;
            // mark this one
            Pla_TtSetBit(pDc, i);
            Pla_TtSetBit(pDc, i ^ (1 << pDirs[v]));
            Cubes[10]++;
            // save
            Vec_IntPushTwo( vStore, i, pDirs[v] );
            continue;
        }

    printf( "\n" );
    printf( "Truth = %d. ", Pla_TtCountOnes(pOn, nWords) );
    printf( "Cover = %d. ", Pla_TtCountOnes(pDc, nWords) );
    printf( "\n" );

    printf( "Count: " );
    for ( i = 0; i < 16; i++ )
        if ( Count[i] )
            printf( "%d=%d ", i, Count[i] );
    printf( "\n" );

    printf( "Cubes: " );
    for ( i = 0; i < 16; i++ )
        if ( Cubes[i] )
            printf( "%d=%d ", i, Cubes[i] );
    printf( "\n" );

/*
    // extract cubes one at a time
    for ( i = 0; i < nMints; i++ )
        if ( Pla_TtGetBit(pOn, i) )
        {
            word Cube = 0;
            for ( v = 0; v < nVars; v++ )
                if ( (i >> v) & 1 )
                    Pla_CubeSetLit( &Cube, v, PLA_LIT_ONE );
                else
                    Pla_CubeSetLit( &Cube, v, PLA_LIT_ZERO );
            Vec_WrdPush( vCubes, Cube );
        }
*/
    Vec_IntForEachEntryDouble( vStore, iMint, iVar, i )
    {
        word Cube = 0;
        for ( v = 0; v < nVars; v++ )
        {
            if ( v == iVar )
                continue;
            if ( (iMint >> v) & 1 )
                Pla_CubeSetLit( &Cube, v, PLA_LIT_ONE );
            else
                Pla_CubeSetLit( &Cube, v, PLA_LIT_ZERO );
        }
        Vec_WrdPush( vCubes, Cube );
    }
    Vec_IntFree( vStore );

    // collect the minterms
    ABC_FREE( pDc );
    return vCubes;
}